

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-docs.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  llama_example in_stack_0000158c;
  string *in_stack_00001590;
  allocator<char> local_69;
  string local_68 [24];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [44];
  undefined4 local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  export_md(in_stack_00001590,in_stack_0000158c);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  export_md(in_stack_00001590,in_stack_0000158c);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return 0;
}

Assistant:

int main(int, char **) {
    export_md("autogen-main.md", LLAMA_EXAMPLE_MAIN);
    export_md("autogen-server.md", LLAMA_EXAMPLE_SERVER);

    return 0;
}